

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::StandardCaseItemSyntax::StandardCaseItemSyntax
          (StandardCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          SyntaxNode *clause)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  undefined8 uVar5;
  ulong uVar6;
  size_t index;
  
  uVar5 = colon._0_8_;
  (this->super_CaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_CaseItemSyntax).super_SyntaxNode.kind = StandardCaseItem;
  SVar2 = (expressions->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(expressions->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent =
       (expressions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->expressions).super_SyntaxListBase.childCount =
       (expressions->super_SyntaxListBase).childCount;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050b090;
  sVar1 = (expressions->elements).size_;
  (this->expressions).elements.data_ = (expressions->elements).data_;
  (this->expressions).elements.size_ = sVar1;
  (this->colon).kind = (short)uVar5;
  (this->colon).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->colon).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->colon).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->colon).info = colon.info;
  (this->clause).ptr = clause;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar6 = (this->expressions).elements.size_ + 1;
  if (1 < uVar6) {
    index = 0;
    do {
      pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[]
                         (&this->expressions,index);
      (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar6 >> 1 != index);
    clause = (this->clause).ptr;
    if (clause == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::SyntaxNode *>::get() const [T = slang::syntax::SyntaxNode *]"
                );
    }
  }
  clause->parent = (SyntaxNode *)this;
  return;
}

Assistant:

StandardCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, SyntaxNode& clause) :
        CaseItemSyntax(SyntaxKind::StandardCaseItem), expressions(expressions), colon(colon), clause(&clause) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->clause->parent = this;
    }